

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::(anonymous_namespace)::InputOutputPair> __thiscall
kj::
heap<kj::(anonymous_namespace)::InputOutputPair,kj::Own<kj::AsyncInputStream>,kj::Own<kj::AsyncOutputStream>>
          (kj *this,Own<kj::AsyncInputStream> *params,Own<kj::AsyncOutputStream> *params_1)

{
  InputOutputPair *this_00;
  Own<kj::AsyncInputStream> *other;
  Own<kj::AsyncOutputStream> *other_00;
  InputOutputPair *extraout_RDX;
  Own<kj::(anonymous_namespace)::InputOutputPair> OVar1;
  Own<kj::AsyncOutputStream> local_40;
  Own<kj::AsyncInputStream> local_30;
  Own<kj::AsyncOutputStream> *local_20;
  Own<kj::AsyncOutputStream> *params_local_1;
  Own<kj::AsyncInputStream> *params_local;
  
  local_20 = params_1;
  params_local_1 = (Own<kj::AsyncOutputStream> *)params;
  params_local = (Own<kj::AsyncInputStream> *)this;
  this_00 = (InputOutputPair *)operator_new(0x30);
  other = fwd<kj::Own<kj::AsyncInputStream>>
                    ((NoInfer<kj::Own<kj::AsyncInputStream>_> *)params_local_1);
  Own<kj::AsyncInputStream>::Own(&local_30,other);
  other_00 = fwd<kj::Own<kj::AsyncOutputStream>>(local_20);
  Own<kj::AsyncOutputStream>::Own(&local_40,other_00);
  anon_unknown_0::InputOutputPair::InputOutputPair(this_00,&local_30,&local_40);
  Own<kj::(anonymous_namespace)::InputOutputPair>::Own
            ((Own<kj::(anonymous_namespace)::InputOutputPair> *)this,this_00,
             (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::InputOutputPair>::instance);
  Own<kj::AsyncOutputStream>::~Own(&local_40);
  Own<kj::AsyncInputStream>::~Own(&local_30);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}